

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O2

void __thiscall tcu::astc::anon_unknown_0::Block128::Block128(Block128 *this,deUint8 *src)

{
  int wordNdx;
  long lVar1;
  long lVar2;
  byte *pbVar3;
  ulong uVar4;
  
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    this->m_words[lVar1] = 0;
    uVar4 = 0;
    pbVar3 = src;
    for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 8) {
      uVar4 = uVar4 | (ulong)*pbVar3 << ((byte)lVar2 & 0x3f);
      this->m_words[lVar1] = uVar4;
      pbVar3 = pbVar3 + 1;
    }
    src = src + 8;
  }
  return;
}

Assistant:

Block128 (const deUint8* src)
	{
		for (int wordNdx = 0; wordNdx < NUM_WORDS; wordNdx++)
		{
			m_words[wordNdx] = 0;
			for (int byteNdx = 0; byteNdx < WORD_BYTES; byteNdx++)
				m_words[wordNdx] |= (Word)src[wordNdx*WORD_BYTES + byteNdx] << (8*byteNdx);
		}
	}